

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_xz.c
# Opt level: O0

void test_option_xz(void)

{
  char *pcVar1;
  ulong local_20;
  size_t s;
  char *pcStack_10;
  int r;
  char *p;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                      ,L'\x11',"f",L'Ƥ',L'\xffffffff',"a");
  s._4_4_ = systemf("%s -cf - --xz f >archive.out 2>archive.err",testprog);
  pcStack_10 = slurpfile(&local_20,"archive.err");
  pcStack_10[local_20] = '\0';
  if (s._4_4_ == L'\0') {
    free(pcStack_10);
    pcStack_10 = slurpfile(&local_20,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                     ,L'%',(uint)(2 < local_20),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                        ,L'&',pcStack_10,"p",anon_var_dwarf_c2a4,
                        "\"\\xFD\\x37\\x7A\\x58\\x5A\\x00\"",6,"6",(void *)0x0);
  }
  else {
    pcVar1 = strstr(pcStack_10,"Unsupported compression");
    if (pcVar1 == (char *)0x0) {
      failure("--xz option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                          ,L'\x1f',(long)s._4_4_,"r",0,"0",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                     ,L'\x1a');
      test_skipping("This version of bsdtar was compiled without xz support");
    }
  }
  free(pcStack_10);
  return;
}

Assistant:

DEFINE_TEST(test_option_xz)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with xz compression. */
	r = systemf("%s -cf - --xz f >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "Unsupported compression") != NULL) {
			skipping("This version of bsdtar was compiled "
			    "without xz support");
			goto done;
		}
		failure("--xz option is broken");
		assertEqualInt(r, 0);
		goto done;
	}
	free(p);
	/* Check that the archive file has an xz signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\xFD\x37\x7A\x58\x5A\x00", 6);
done:
	free(p);
}